

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O1

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
          double __x)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  mapped_type *pmVar2;
  size_t __n;
  long in_RSI;
  undefined1 *__ptr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_220 [504];
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  __ptr = local_220;
  (*((this->super_sink).formatter_._M_t.
     super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
     super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
     super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[2])();
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    fwrite(__ptr,1,*(ulong *)(in_RSI + 0x28),(FILE *)this->target_file_);
    pmVar2 = std::__detail::
             _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->colors_,(key_type *)(in_RSI + 8));
    fwrite((pmVar2->_M_dataplus)._M_p,1,pmVar2->_M_string_length,(FILE *)this->target_file_);
    fwrite(__ptr + *(long *)(in_RSI + 0x28),1,*(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28),
           (FILE *)this->target_file_);
    fwrite((this->reset)._M_dataplus._M_p,1,(this->reset)._M_string_length,
           (FILE *)this->target_file_);
    __ptr = __ptr + *(long *)(in_RSI + 0x30);
    __n = -*(long *)(in_RSI + 0x30);
  }
  else {
    __n = 0;
  }
  fwrite(__ptr,1,__n,(FILE *)this->target_file_);
  fflush((FILE *)this->target_file_);
  pthread_mutex_unlock(__mutex);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

void log(const details::log_msg &msg) override
    {
        // Wrap the originally formatted message in color codes.
        // If color is not supported in the terminal, log as is instead.
        std::lock_guard<mutex_t> lock(mutex_);

        fmt::memory_buffer formatted;
        formatter_->format(msg, formatted);
        if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
        {
            // before color range
            print_range_(formatted, 0, msg.color_range_start);
            // in color range
            print_ccode_(colors_[msg.level]);
            print_range_(formatted, msg.color_range_start, msg.color_range_end);
            print_ccode_(reset);
            // after color range
            print_range_(formatted, msg.color_range_end, formatted.size());
        }
        else // no color
        {
            print_range_(formatted, 0, formatted.size());
        }
        fflush(target_file_);
    }